

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O1

mraa_result_t mraa_intel_edison_gpio_mode_replace(mraa_gpio_context dev,mraa_gpio_mode_t mode)

{
  bool bVar1;
  int iVar2;
  mraa_result_t mVar3;
  mraa_result_t mVar4;
  mraa_gpio_context dev_00;
  char *__fmt;
  
  if (dev->value_fp != -1) {
    iVar2 = close(dev->value_fp);
    if (iVar2 != 0) {
      return MRAA_ERROR_INVALID_RESOURCE;
    }
    dev->value_fp = -1;
  }
  dev_00 = mraa_gpio_init_raw(pullup_map[dev->phy_pin]);
  mVar4 = MRAA_ERROR_INVALID_RESOURCE;
  if (dev_00 != (mraa_gpio_context)0x0) {
    mVar4 = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    mVar3 = mraa_gpio_dir(dev_00,MRAA_GPIO_IN);
    if (mVar3 == MRAA_SUCCESS) {
      switch(mode) {
      case MRAA_GPIO_STRONG:
      case MRAA_GPIO_HIZ:
        iVar2 = -1;
        bVar1 = true;
        break;
      case MRAA_GPIO_PULLUP:
        iVar2 = 1;
        bVar1 = false;
        break;
      case MRAA_GPIO_PULLDOWN:
        bVar1 = false;
        iVar2 = 0;
        break;
      default:
        goto switchD_00117c05_default;
      }
      if ((bVar1) ||
         ((mVar4 = mraa_gpio_dir(dev_00,MRAA_GPIO_OUT), mVar4 == MRAA_SUCCESS &&
          (mVar4 = mraa_gpio_write(dev_00,iVar2), mVar4 == MRAA_SUCCESS)))) {
        mVar4 = mraa_gpio_close(dev_00);
        return mVar4;
      }
      __fmt = "edison: Error setting pullup";
    }
    else {
      __fmt = "edison: Failed to set gpio mode-pullup";
    }
    syslog(3,__fmt);
    mraa_gpio_close(dev_00);
    mVar4 = MRAA_ERROR_INVALID_RESOURCE;
  }
switchD_00117c05_default:
  return mVar4;
}

Assistant:

mraa_result_t
mraa_intel_edison_gpio_mode_replace(mraa_gpio_context dev, mraa_gpio_mode_t mode)
{
    if (dev->value_fp != -1) {
        if (close(dev->value_fp) != 0) {
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        dev->value_fp = -1;
    }

    mraa_gpio_context pullup_e;
    pullup_e = mraa_gpio_init_raw(pullup_map[dev->phy_pin]);
    if (pullup_e == NULL) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_dir(pullup_e, MRAA_GPIO_IN) != MRAA_SUCCESS) {
        syslog(LOG_ERR, "edison: Failed to set gpio mode-pullup");
        mraa_gpio_close(pullup_e);
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    int value = -1;
    switch (mode) {
        case MRAA_GPIO_STRONG:
            break;
        case MRAA_GPIO_PULLUP:
            value = 1;
            break;
        case MRAA_GPIO_PULLDOWN:
            value = 0;
            break;
        case MRAA_GPIO_HIZ:
            break;
        default:
            return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }
    if (value != -1) {
        if (mraa_gpio_dir(pullup_e, MRAA_GPIO_OUT) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "edison: Error setting pullup");
            mraa_gpio_close(pullup_e);
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        if (mraa_gpio_write(pullup_e, value) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "edison: Error setting pullup");
            mraa_gpio_close(pullup_e);
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    }

    return mraa_gpio_close(pullup_e);
}